

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_per_ema.c
# Opt level: O2

ErrorNumber test_func_per_ema(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  ulong uVar3;
  TA_Test_conflict9 *pTVar4;
  ulong uVar5;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict9 *local_40;
  TA_Real *local_38;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  pTVar4 = tableTest;
  uVar3 = 0;
  while( true ) {
    if (uVar3 == 4) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
    if ((int)history->nbBars < pTVar4->expectedNbElement) {
      printf("TA_MA Failed Bad Parameter for Test #%d (%d,%d)\n",uVar3 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->close,history->nbBars);
    setInputBuffer(1,history->close,history->nbBars);
    TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_EMA,pTVar4->unstablePeriod);
    if (TVar1 != TA_SUCCESS) {
      uVar5 = 0x8a;
      goto LAB_0011834c;
    }
    TVar1 = TA_SUCCESS;
    if (pTVar4->theFunction == TA_ANY_MA_TEST) {
      TVar1 = TA_TRIX(pTVar4->startIdx,pTVar4->endIdx,gBuffer[0].in,pTVar4->optInTimePeriod,
                      &outBegIdx,&outNbElement,gBuffer[0].out0);
    }
    EVar2 = checkDataSame(gBuffer[0].in,history->close,history->nbBars);
    if ((EVar2 != TA_TEST_PASS) ||
       (EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar4->expectedRetCode,outBegIdx,
                                   pTVar4->expectedBegIdx,outNbElement,pTVar4->expectedNbElement,
                                   pTVar4->oneOfTheExpectedOutReal,
                                   pTVar4->oneOfTheExpectedOutRealIndex), EVar2 != TA_TEST_PASS))
    break;
    outNbElement = 0;
    outBegIdx = 0;
    if (pTVar4->theFunction == TA_ANY_MA_TEST) {
      TVar1 = TA_TRIX(pTVar4->startIdx,pTVar4->endIdx,gBuffer[1].in,pTVar4->optInTimePeriod,
                      &outBegIdx,&outNbElement,gBuffer[1].in);
    }
    EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[1].in);
    if (((EVar2 != TA_TEST_PASS) ||
        (EVar2 = checkExpectedValue(gBuffer[1].in,TVar1,pTVar4->expectedRetCode,outBegIdx,
                                    pTVar4->expectedBegIdx,outNbElement,pTVar4->expectedNbElement,
                                    pTVar4->oneOfTheExpectedOutReal,
                                    pTVar4->oneOfTheExpectedOutRealIndex), EVar2 != TA_TEST_PASS))
       || ((local_38 = history->close, local_40 = pTVar4, pTVar4->doRangeTestFlag != 0 &&
           (EVar2 = doRangeTest(rangeTestFunction,TA_FUNC_UNST_EMA,&local_40,1,0),
           EVar2 != TA_TEST_PASS)))) break;
    uVar3 = uVar3 + 1;
    pTVar4 = pTVar4 + 1;
  }
  uVar5 = (ulong)EVar2;
LAB_0011834c:
  printf("TA_MA Failed Test #%d (Code=%d)\n",uVar3 & 0xffffffff,uVar5);
  return (ErrorNumber)uVar5;
}

Assistant:

ErrorNumber test_func_per_ema( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "TA_MA Failed Bad Parameter for Test #%d (%d,%d)\n",
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test_per_ema( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "TA_MA Failed Test #%d (Code=%d)\n", i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}